

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::parseStringTemplate(SQParser *this)

{
  uint uVar1;
  Arena *this_00;
  Expr **ppEVar2;
  Expr *pEVar3;
  CallExpr *this_01;
  Chunk *pCVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  SQUnsignedInteger size;
  sqvector<char,_unsigned_int> formatString;
  sqvector<SQCompilation::Expr_*,_unsigned_int> args;
  char buffer [64];
  sqvector<char,_unsigned_int> local_c8;
  sqvector<SQCompilation::Expr_*,_unsigned_int> local_b0;
  SQInteger local_98;
  SQInteger local_90;
  SQInteger local_88;
  SQInteger local_80;
  SQChar local_78 [72];
  
  (this->_lex)._state = LS_TEMPALTE;
  (this->_lex)._expectedToken = 0x151;
  local_90 = (this->_lex)._tokencolumn;
  local_98 = (this->_lex)._tokenline;
  Lex(this);
  local_c8._alloc_ctx = this->_ctx->_vm->_sharedstate->_alloc_ctx;
  local_c8._vals = (SQChar *)0x0;
  local_c8._size = 0;
  local_c8._allocated = 0;
  local_b0._vals = (Expr **)0x0;
  local_b0._size = 0;
  local_b0._allocated = 0;
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_80 = (this->_lex)._tokencolumn;
  local_88 = (this->_lex)._tokenline;
  uVar6 = 0;
  local_b0._alloc_ctx = local_c8._alloc_ctx;
  while (lVar8 = this->_token, lVar8 != 0) {
    if (lVar8 - 0x154U < 0xfffffffffffffffd) {
      this_01 = (CallExpr *)0x0;
      reportDiagnostic(this,0x19,"STRING_LITERAL");
      goto LAB_0016371f;
    }
    appendStringData(&local_c8,(this->_lex)._svalue);
    if (lVar8 == 0x153) break;
    snprintf(local_78,0x40,"%d",uVar6);
    appendStringData(&local_c8,local_78);
    (this->_lex)._expectedToken = -1;
    (this->_lex)._state = LS_REGULAR;
    Lex(this);
    pEVar3 = Expression(this,SQE_FUNCTION_ARG);
    if (local_b0._allocated <= local_b0._size) {
      uVar1 = local_b0._size * 2;
      if (local_b0._size * 2 == 0) {
        uVar1 = 4;
      }
      local_b0._vals =
           (Expr **)sq_vm_realloc(local_b0._alloc_ctx,local_b0._vals,(ulong)local_b0._allocated << 3
                                  ,(ulong)uVar1 * 8);
      local_b0._allocated = uVar1;
    }
    uVar1 = local_b0._size + 1;
    local_b0._vals[local_b0._size] = pEVar3;
    local_b0._size = uVar1;
    if (this->_token != 0x7d) {
      this_01 = (CallExpr *)0x0;
      reportDiagnostic(this,0x19,"}");
      goto LAB_0016371f;
    }
    if (local_c8._allocated <= local_c8._size) {
      uVar1 = local_c8._size * 2;
      if (local_c8._size * 2 == 0) {
        uVar1 = 4;
      }
      local_c8._vals =
           (char *)sq_vm_realloc(local_c8._alloc_ctx,local_c8._vals,(ulong)local_c8._allocated,
                                 (ulong)uVar1);
      local_c8._allocated = uVar1;
    }
    local_c8._vals[local_c8._size] = '}';
    (this->_lex)._state = LS_TEMPALTE;
    (this->_lex)._expectedToken = 0x152;
    uVar6 = (ulong)((int)uVar6 + 1);
    local_c8._size = local_c8._size + 1;
    Lex(this);
  }
  if (local_c8._size < local_c8._allocated) {
    iVar7 = (int)local_90;
    iVar5 = (int)local_98;
  }
  else {
    size = 4;
    if (local_c8._size * 2 != 0) {
      size = (SQUnsignedInteger)(local_c8._size * 2);
    }
    local_c8._vals =
         (char *)sq_vm_realloc(local_c8._alloc_ctx,local_c8._vals,(ulong)local_c8._allocated,size);
    iVar7 = (int)local_90;
    iVar5 = (int)local_98;
    local_c8._allocated = (size_type)size;
  }
  local_c8._size = 1;
  *local_c8._vals = '\0';
  this_01 = (CallExpr *)newStringLiteral(this,local_c8._vals);
  (this_01->super_Expr).super_Node._coordinates.lineStart = (int)local_88;
  (this_01->super_Expr).super_Node._coordinates.columnStart = (int)local_80;
  (this_01->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (this_01->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
  if (local_b0._size != 0) {
    pCVar4 = Arena::findChunk(this->_astArena,0x40);
    pEVar3 = (Expr *)pCVar4->_ptr;
    pCVar4->_ptr = (uint8_t *)(pEVar3 + 2);
    (pEVar3->super_Node)._op = TO_GETFIELD;
    (pEVar3->super_Node)._coordinates.lineEnd = -1;
    (pEVar3->super_Node)._coordinates.columnEnd = -1;
    pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj = (_func_int **)this_01;
    *(undefined1 *)&pEVar3[1].super_Node._coordinates.lineStart = 0;
    *(char **)&pEVar3[1].super_Node._coordinates.lineEnd = "subst";
    (pEVar3->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2e08;
    *(undefined1 *)&pEVar3[1].super_Node._op = TO_IF;
    (pEVar3->super_Node)._coordinates.lineStart = iVar5;
    (pEVar3->super_Node)._coordinates.columnStart = iVar7;
    (pEVar3->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pEVar3->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    this_00 = this->_astArena;
    pCVar4 = Arena::findChunk(this_00,0x48);
    ppEVar2 = local_b0._vals;
    this_01 = (CallExpr *)pCVar4->_ptr;
    pCVar4->_ptr = (uint8_t *)(this_01 + 1);
    (this_01->super_Expr).super_Node._op = TO_CALL;
    (this_01->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_01->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_01->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2dd0;
    this_01->_callee = pEVar3;
    (this_01->_args)._arena = this_00;
    (this_01->_args)._vals = (Expr **)0x0;
    (this_01->_args)._size = 0;
    (this_01->_args)._allocated = 0;
    this_01->_nullable = false;
    (this_01->super_Expr).super_Node._coordinates.lineStart = iVar5;
    (this_01->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_01->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_01->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    uVar6 = (ulong)local_b0._size;
    if (uVar6 != 0) {
      lVar8 = 0;
      do {
        CallExpr::addArgument(this_01,*(Expr **)((long)ppEVar2 + lVar8));
        lVar8 = lVar8 + 8;
      } while (uVar6 << 3 != lVar8);
    }
  }
  (this->_lex)._expectedToken = -1;
  (this->_lex)._state = LS_REGULAR;
  Lex(this);
LAB_0016371f:
  sqvector<SQCompilation::Expr_*,_unsigned_int>::~sqvector(&local_b0);
  sqvector<char,_unsigned_int>::~sqvector(&local_c8);
  return &this_01->super_Expr;
}

Assistant:

Expr *SQParser::parseStringTemplate() {

    // '$' TK_TEMPLATE_PREFIX? (arg TK_TEMPLATE_INFIX)* arg? TK_TEMPLATE_SUFFX

    _lex._state = LS_TEMPALTE;
    _lex._expectedToken = TK_TEMPLATE_PREFIX;

    SQInteger l = line(), c = column();

    Lex();
    int idx = 0;

    sqvector<SQChar> formatString(_ctx.allocContext());
    sqvector<Expr *> args(_ctx.allocContext());
    char buffer[64] = {0};

    SQInteger fmtL = line(), fmtC = column();
    SQInteger tok = -1;

    while ((tok = _token) != SQUIRREL_EOB) {

      if (tok != TK_TEMPLATE_PREFIX && tok != TK_TEMPLATE_INFIX && tok != TK_TEMPLATE_SUFFIX) {
          reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("STRING_LITERAL"));
          return nullptr;
      }

      appendStringData(formatString, _lex._svalue);
      if (tok != TK_TEMPLATE_SUFFIX) {
        snprintf(buffer, sizeof buffer, "%d", idx++);
        appendStringData(formatString, buffer);
        _lex._expectedToken = -1;
        _lex._state = LS_REGULAR;
        Lex();
        Expr *arg = Expression(SQE_FUNCTION_ARG);
        args.push_back(arg);

        if (_token != _SC('}')) {
            reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("}"));
            return nullptr;
        }

        formatString.push_back(_SC('}'));

        _lex._state = LS_TEMPALTE;
        _lex._expectedToken = TK_TEMPLATE_INFIX;
      }
      else {
        break;
      }
      Lex();
    }

    formatString.push_back('\0');

    Expr *result = nullptr;
    LiteralExpr *fmt = setCoordinates(newStringLiteral(&formatString[0]), fmtL, fmtC);

    if (args.empty()) {
      result = fmt;
    }
    else {
      Expr *callee = setCoordinates(newNode<GetFieldExpr>(fmt, "subst", false, /* force type method */ true), l, c);
      CallExpr *call = setCoordinates(newNode<CallExpr>(arena(), callee, false), l, c);

      for (Expr *arg : args)
        call->addArgument(arg);

      result = call;
    }

    _lex._expectedToken = -1;
    _lex._state = LS_REGULAR;
    Lex();

    return result;
}